

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

aiQuaternion __thiscall
Assimp::FBX::FBXConverter::EulerToQuaternion(FBXConverter *this,aiVector3D *rot,RotOrder order)

{
  aiMatrix4x4 m;
  aiQuaternion local_88;
  aiMatrix3x3t<float> local_78;
  aiMatrix4x4 local_48;
  
  local_48.a1 = 1.0;
  local_48.a2 = 0.0;
  local_48.a3 = 0.0;
  local_48.a4 = 0.0;
  local_48.b1 = 0.0;
  local_48.b2 = 1.0;
  local_48.b3 = 0.0;
  local_48.b4 = 0.0;
  local_48.c1 = 0.0;
  local_48.c2 = 0.0;
  local_48.c3 = 1.0;
  local_48.c4 = 0.0;
  local_48.d1 = 0.0;
  local_48.d2 = 0.0;
  local_48.d3 = 0.0;
  local_48.d4 = 1.0;
  GetRotationMatrix(this,order,rot,&local_48);
  local_78.c1 = local_48.c1;
  local_78.c2 = local_48.c2;
  local_78.a1 = local_48.a1;
  local_78.a2 = local_48.a2;
  local_78.a3 = local_48.a3;
  local_78.b1 = local_48.b1;
  local_78.b2 = local_48.b2;
  local_78.b3 = local_48.b3;
  local_78.c3 = local_48.c3;
  aiQuaterniont<float>::aiQuaterniont(&local_88,&local_78);
  return local_88;
}

Assistant:

aiQuaternion FBXConverter::EulerToQuaternion(const aiVector3D& rot, Model::RotOrder order)
        {
            aiMatrix4x4 m;
            GetRotationMatrix(order, rot, m);

            return aiQuaternion(aiMatrix3x3(m));
        }